

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

void __thiscall
LinearScan::ProcessSecondChanceBoundaryHelper
          (LinearScan *this,BranchInstr *branchInstr,LabelInstr *branchLabel)

{
  RealCount *pRVar1;
  OpCode OVar2;
  SList<Lifetime_**,_Memory::ArenaAllocator,_RealCount> *pSVar3;
  LabelInstr *pLVar4;
  code *pcVar5;
  bool bVar6;
  uint32 uVar7;
  uint32 uVar8;
  undefined4 *puVar9;
  Type pSVar10;
  Instr *pIVar11;
  LoweredBasicBlock *pLVar12;
  char *message;
  char *error;
  uint lineNumber;
  
  uVar7 = IR::Instr::GetNumber(&branchInstr->super_Instr);
  uVar8 = IR::Instr::GetNumber(&branchLabel->super_Instr);
  if (uVar8 < uVar7) {
    if ((branchLabel->field_0x78 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0xebe,"(branchLabel->m_isLoopTop)","branchLabel->m_isLoopTop");
      if (!bVar6) goto LAB_0058f664;
      *puVar9 = 0;
    }
    branchInstr->m_regContent = (Lifetime **)0x0;
    InsertSecondChanceCompensation
              (this,this->regContent,branchLabel->m_regContent,branchInstr,branchLabel);
    return;
  }
  SaveRegContent(this,&branchInstr->super_Instr);
  if (this->curLoop != (Loop *)0x0) {
    pSVar3 = (this->curLoop->regAlloc).exitRegContentList;
    pSVar10 = (Type)new<Memory::ArenaAllocator>(0x10,pSVar3->allocator,0x366bee);
    pSVar10[1].next = (Type)branchInstr->m_regContent;
    pSVar10->next =
         (pSVar3->super_SListBase<Lifetime_**,_Memory::ArenaAllocator,_RealCount>).
         super_SListNodeBase<Memory::ArenaAllocator>.next;
    (pSVar3->super_SListBase<Lifetime_**,_Memory::ArenaAllocator,_RealCount>).
    super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar10;
    pRVar1 = &(pSVar3->super_SListBase<Lifetime_**,_Memory::ArenaAllocator,_RealCount>).
              super_RealCount;
    pRVar1->count = pRVar1->count + 1;
  }
  if (branchLabel->m_loweredBasicBlock != (LoweredBasicBlock *)0x0) {
    pLVar12 = this->currentBlock;
    if (((pLVar12->inlineeFrameLifetimes).
         super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.count < 1) &&
       ((pLVar12->inlineeStack).
        super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>.count < 1)) {
      return;
    }
    bVar6 = LoweredBasicBlock::Equals(branchLabel->m_loweredBasicBlock,pLVar12);
    if (bVar6) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xeec,
                       "(!currentBlock->HasData() || branchLabel->m_loweredBasicBlock->Equals(this->currentBlock))"
                       ,
                       "!currentBlock->HasData() || branchLabel->m_loweredBasicBlock->Equals(this->currentBlock)"
                      );
    if (bVar6) {
      *puVar9 = 0;
      return;
    }
    goto LAB_0058f664;
  }
  OVar2 = (branchInstr->super_Instr).m_opcode;
  if (OVar2 < ADD) {
    bVar6 = OVar2 == MultiBr || OVar2 == Br;
  }
  else {
    bVar6 = LowererMD::IsUnconditionalBranch(&branchInstr->super_Instr);
  }
  if (bVar6 != false) {
    pLVar4 = branchInstr->m_branchTarget;
    if (pLVar4 == (LabelInstr *)0x0) {
      if (branchInstr->m_isMultiBranch == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        error = "(m_isMultiBranch)";
        message = "m_isMultiBranch";
        lineNumber = 0x20e;
        goto LAB_0058f5dc;
      }
    }
    else if (branchInstr->m_isMultiBranch != false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      error = "(!m_isMultiBranch)";
      message = "!m_isMultiBranch";
      lineNumber = 0x209;
LAB_0058f5dc:
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,lineNumber,error,message);
      if (!bVar6) {
LAB_0058f664:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar9 = 0;
    }
    if (pLVar4 != (LabelInstr *)0x0) {
      pIVar11 = IR::Instr::GetNextRealInstr(&branchLabel->super_Instr);
      if (pIVar11->m_opcode == FunctionExit) {
        return;
      }
      if (pIVar11->m_opcode == BailOutStackRestore) {
        return;
      }
      if (((this->currentBlock->inlineeFrameLifetimes).
           super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.count < 1) &&
         ((this->currentBlock->inlineeStack).
          super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>.count < 1)) {
        return;
      }
      pIVar11 = IR::Instr::GetNextRealInstrOrLabel(&branchInstr->super_Instr);
      if ((pIVar11->m_kind == InstrKindProfiledLabel) || (pIVar11->m_kind == InstrKindLabel)) {
        pLVar12 = this->currentBlock;
        goto LAB_0058f64e;
      }
    }
  }
  pLVar12 = LoweredBasicBlock::Clone(this->currentBlock,this->tempAlloc);
LAB_0058f64e:
  branchLabel->m_loweredBasicBlock = pLVar12;
  return;
}

Assistant:

void
LinearScan::ProcessSecondChanceBoundaryHelper(IR::BranchInstr *branchInstr, IR::LabelInstr *branchLabel)
{
    if (branchInstr->GetNumber() > branchLabel->GetNumber())
    {
        // Loop back-edge
        Assert(branchLabel->m_isLoopTop);
        branchInstr->m_regContent = nullptr;
        this->InsertSecondChanceCompensation(this->regContent, branchLabel->m_regContent, branchInstr, branchLabel);
    }
    else
    {
        // Forward branch
        this->SaveRegContent(branchInstr);
        if (this->curLoop)
        {
            this->curLoop->regAlloc.exitRegContentList->Prepend(branchInstr->m_regContent);
        }
        if (!branchLabel->m_loweredBasicBlock)
        {
            if (branchInstr->IsConditional() || branchInstr->IsMultiBranch())
            {
                // Clone with deep copy
                branchLabel->m_loweredBasicBlock = this->currentBlock->Clone(this->tempAlloc);
            }
            else
            {
                // If the unconditional branch leads to the end of the function for the scenario of a bailout - we do not want to
                // copy the lowered inlinee info.
                IR::Instr* nextInstr = branchLabel->GetNextRealInstr();
                if (nextInstr->m_opcode != Js::OpCode::FunctionExit &&
                    nextInstr->m_opcode != Js::OpCode::BailOutStackRestore &&
                    this->currentBlock->HasData())
                {
                    IR::Instr* branchNextInstr = branchInstr->GetNextRealInstrOrLabel();
                    if (branchNextInstr->IsLabelInstr())
                    {
                        // Clone with shallow copy
                        branchLabel->m_loweredBasicBlock = this->currentBlock;
                    }
                    else
                    {
                        // Dead code after the unconditional branch causes the currentBlock data to be freed later on...
                        // Deep copy in this case.
                        branchLabel->m_loweredBasicBlock = this->currentBlock->Clone(this->tempAlloc);
                    }
                }
            }
        }
        else
        {
            // The lowerer sometimes generates unreachable blocks that would have empty data.
            Assert(!currentBlock->HasData() || branchLabel->m_loweredBasicBlock->Equals(this->currentBlock));
        }
    }
}